

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

QStringList *
QFontDatabase::families(QStringList *__return_storage_ptr__,WritingSystem writingSystem)

{
  QtFontFamily *pQVar1;
  QArrayData *pQVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QDeadlineTimer QVar9;
  QLatin1String QVar10;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar6 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                       *)__return_storage_ptr__);
  if (pTVar6 != (Type *)0x0) {
    QVar9.t2 = 0xffffffff;
    QVar9.type = 0x7fffffff;
    QVar9.t1 = (qint64)pTVar6;
    QRecursiveMutex::tryLock(QVar9);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  if (0 < QFontDatabasePrivate::instance::instance.count) {
    lVar7 = 0;
    do {
      pQVar1 = QFontDatabasePrivate::instance::instance.families[lVar7];
      bVar4 = *(byte *)pQVar1;
      if ((bVar4 & 1) == 0) {
        if (writingSystem == Any) goto LAB_0025aef8;
        iVar5 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x20))
                  ((long *)CONCAT44(extraout_var,iVar5),&pQVar1->name);
        bVar4 = *(byte *)pQVar1;
        if ((bVar4 & 1) != 0) goto LAB_0025aeeb;
      }
      else if (pQVar1->count != 0) {
        if (writingSystem != Any) {
LAB_0025aeeb:
          if (pQVar1->writingSystems[writingSystem] != '\x01') goto LAB_0025af20;
        }
LAB_0025aef8:
        if (((bVar4 & 1) == 0) || (pQVar1->count == 1)) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,&pQVar1->name);
          QList<QString>::end(__return_storage_ptr__);
        }
        else if (0 < pQVar1->count) {
          lVar8 = 0;
          do {
            local_58.d.d = (pQVar1->name).d.d;
            local_58.d.ptr = (pQVar1->name).d.ptr;
            local_58.d.size = (pQVar1->name).d.size;
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pQVar2 = &((pQVar1->foundries[lVar8]->name).d.d)->super_QArrayData;
            lVar3 = (pQVar1->foundries[lVar8]->name).d.size;
            if (pQVar2 != (QArrayData *)0x0) {
              LOCK();
              (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (lVar3 != 0) {
              QVar10.m_data = (char *)0x2;
              QVar10.m_size = (qsizetype)&local_58;
              QString::append(QVar10);
              QString::append((QString *)&local_58);
              QString::append((QChar)(char16_t)&local_58);
            }
            QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                      ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,&local_58);
            QList<QString>::end(__return_storage_ptr__);
            if (pQVar2 != (QArrayData *)0x0) {
              LOCK();
              (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar2,2,0x10);
              }
            }
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < pQVar1->count);
        }
      }
LAB_0025af20:
      lVar7 = lVar7 + 1;
    } while (lVar7 < QFontDatabasePrivate::instance::instance.count);
  }
  if (pTVar6 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QFontDatabase::families(WritingSystem writingSystem)
{
    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QStringList flist;
    for (int i = 0; i < d->count; i++) {
        QtFontFamily *f = d->families[i];
        if (f->populated && f->count == 0)
            continue;
        if (writingSystem != Any) {
            if (!f->ensurePopulated())
                continue;
            if (f->writingSystems[writingSystem] != QtFontFamily::Supported)
                continue;
        }
        if (!f->populated || f->count == 1) {
            flist.append(f->name);
        } else {
            for (int j = 0; j < f->count; j++) {
                QString str = f->name;
                QString foundry = f->foundries[j]->name;
                if (!foundry.isEmpty()) {
                    str += " ["_L1;
                    str += foundry;
                    str += u']';
                }
                flist.append(str);
            }
        }
    }
    return flist;
}